

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  SPIRType *pSVar4;
  Bitset *pBVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  string local_270;
  Bitset member_decorations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string mbr_name;
  string semantic;
  SPIRType type;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar4);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_(&semantic,this,location,pSVar3->model,var->storage);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&member_decorations,this,(ulong)type.super_IVariant.self.id,1);
  CompilerGLSL::to_member_name_abi_cxx11_(&local_270,&this->super_CompilerGLSL,&type,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (&mbr_name,(spirv_cross *)&member_decorations,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330c68,
             (char (*) [2])&local_270,ts_2);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::__cxx11::string::~string((string *)&member_decorations);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,
                      type.member_types.
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [member_index].id);
  pBVar5 = Compiler::get_member_decoration_bitset
                     ((Compiler *)this,(TypeID)type.super_IVariant.self.id,member_index);
  Bitset::Bitset(&member_decorations,pBVar5);
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
  if (bVar1) {
    Bitset::set(&member_decorations,0x14a5);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])
            (&local_270,this,&member_decorations);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1f0,this,pSVar4,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
            (&local_210,this,pSVar4,(ulong)(var->super_IVariant).self.id);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_270,&local_1f0,(char (*) [2])0x3175f1,&mbr_name,
             &local_210,(char (*) [4])0x354db8,&semantic,(char (*) [2])0x344fd0);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_270);
  uVar2 = type_to_consumed_locations(this,pSVar4);
  while (bVar1 = uVar2 != 0, uVar2 = uVar2 - 1, bVar1) {
    local_270._M_dataplus._M_p._0_4_ = location;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)active_locations,(value_type *)&local_270);
    location = location + 1;
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&member_decorations.higher._M_h);
  ::std::__cxx11::string::~string((string *)&mbr_name);
  ::std::__cxx11::string::~string((string *)&semantic);
  SPIRType::~SPIRType(&type);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	Bitset member_decorations = get_member_decoration_bitset(type.self, member_index);
	if (has_decoration(var.self, DecorationPerVertexKHR))
		member_decorations.set(DecorationPerVertexKHR);

	statement(to_interpolation_qualifiers(member_decorations),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}